

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu383_com.c
# Opt level: O0

RK_S32 vdpu383_set_rcbinfo(MppDev dev,Vdpu383RcbInfo *rcb_info)

{
  RK_U32 index;
  Vdpu383RcbInfo *info_1;
  Vdpu383RcbInfo info [11];
  uint auStack_58 [2];
  RK_U32 rcb_priority [11];
  uint local_24;
  Vdpu383RcbSetMode_e set_rcb_mode;
  RK_U32 i;
  MppDevRcbInfoCfg rcb_cfg;
  Vdpu383RcbInfo *rcb_info_local;
  MppDev dev_local;
  
  rcb_priority[10] = 1;
  rcb_priority[6] = 9;
  rcb_priority[7] = 10;
  rcb_priority[8] = 7;
  rcb_priority[2] = 3;
  rcb_priority[3] = 5;
  rcb_priority[4] = 1;
  rcb_priority[5] = 8;
  rcb_priority[0] = 4;
  rcb_priority[1] = 0;
  rcb_cfg = (MppDevRcbInfoCfg)rcb_info;
  for (local_24 = 0; local_24 < 0xb; local_24 = local_24 + 1) {
    set_rcb_mode = rcb_info[rcb_priority[(ulong)local_24 - 2]].reg_idx;
    i = rcb_info[rcb_priority[(ulong)local_24 - 2]].size;
    if (i != 0) {
      mpp_dev_ioctl(dev,8,&set_rcb_mode);
    }
  }
  return 0;
}

Assistant:

RK_S32 vdpu383_set_rcbinfo(MppDev dev, Vdpu383RcbInfo *rcb_info)
{
    MppDevRcbInfoCfg rcb_cfg;
    RK_U32 i;

    Vdpu383RcbSetMode_e set_rcb_mode = RCB_SET_BY_PRIORITY_MODE;

    RK_U32 rcb_priority[RCB_BUF_COUNT] = {
        RCB_FILTERD_ROW,
        RCB_INTER_ROW,
        RCB_INTRA_ROW,
        RCB_STRMD_ROW,
        RCB_INTER_TILE_ROW,
        RCB_INTRA_TILE_ROW,
        RCB_STRMD_TILE_ROW,
        RCB_FILTERD_TILE_ROW,
        RCB_FILTERD_TILE_COL,
        RCB_FILTERD_AV1_UP_TILE_COL,
        RCB_FILTERD_PROTECT_ROW,
    };
    /*
     * RCB_SET_BY_SIZE_SORT_MODE: by size sort
     * RCB_SET_BY_PRIORITY_MODE: by priority
     */

    switch (set_rcb_mode) {
    case RCB_SET_BY_SIZE_SORT_MODE : {
        Vdpu383RcbInfo info[RCB_BUF_COUNT];

        memcpy(info, rcb_info, sizeof(info));
        qsort(info, MPP_ARRAY_ELEMS(info),
              sizeof(info[0]), vdpu383_compare_rcb_size);

        for (i = 0; i < MPP_ARRAY_ELEMS(info); i++) {
            rcb_cfg.reg_idx = info[i].reg_idx;
            rcb_cfg.size = info[i].size;
            if (rcb_cfg.size > 0) {
                mpp_dev_ioctl(dev, MPP_DEV_RCB_INFO, &rcb_cfg);
            } else
                break;
        }
    } break;
    case RCB_SET_BY_PRIORITY_MODE : {
        Vdpu383RcbInfo *info = rcb_info;
        RK_U32 index = 0;

        for (i = 0; i < MPP_ARRAY_ELEMS(rcb_priority); i ++) {
            index = rcb_priority[i];

            rcb_cfg.reg_idx = info[index].reg_idx;
            rcb_cfg.size = info[index].size;
            if (rcb_cfg.size > 0) {
                mpp_dev_ioctl(dev, MPP_DEV_RCB_INFO, &rcb_cfg);
            }
        }
    } break;
    default:
        break;
    }

    return 0;
}